

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_sqlite.cpp
# Opt level: O0

sqlite3_value * duckdb::CastToSQLiteValue::Operation<double>(double input)

{
  sqlite3_value *in_RDI;
  
  OperationFloat<double>((double)in_RDI);
  return in_RDI;
}

Assistant:

sqlite3_value CastToSQLiteValue::Operation(double input) {
	return OperationFloat<double>(input);
}